

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unordered_set_constructor_test.h
# Opt level: O3

void __thiscall
phmap::priv::gtest_suite_ConstructorTest_::
MoveAssignmentOverwritesExisting<phmap::parallel_flat_hash_set<int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>,_4UL,_phmap::NullMutex>_>
::TestBody(MoveAssignmentOverwritesExisting<phmap::parallel_flat_hash_set<int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>,_4UL,_phmap::NullMutex>_>
           *this)

{
  result_type_conflict1 rVar1;
  mt19937_64 *pmVar2;
  long lVar3;
  char *message;
  TypeParam n;
  TypeParam t;
  TypeParam m;
  allocator_type local_dc0;
  param_type local_db8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_db0;
  AssertHelper local_da8;
  result_type_conflict1 local_d9c;
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>
  local_d98;
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>
  local_918;
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>
  local_498;
  
  local_918.sets_._M_elems[0].set_.ctrl_ = (ctrl_t *)0x7fffffff00000000;
  pmVar2 = hash_internal::GetSharedRng();
  rVar1 = std::uniform_int_distribution<int>::operator()
                    ((uniform_int_distribution<int> *)&local_918,pmVar2,(param_type *)&local_918);
  local_918.sets_._M_elems[0].set_.ctrl_ =
       (ctrl_t *)CONCAT44(local_918.sets_._M_elems[0].set_.ctrl_._4_4_,rVar1);
  local_d98.sets_._M_elems[0].set_.ctrl_ = (ctrl_t *)0x7fffffff00000000;
  pmVar2 = hash_internal::GetSharedRng();
  rVar1 = std::uniform_int_distribution<int>::operator()
                    ((uniform_int_distribution<int> *)&local_d98,pmVar2,(param_type *)&local_d98);
  local_918.sets_._M_elems[0].set_.ctrl_ =
       (ctrl_t *)CONCAT44(rVar1,local_918.sets_._M_elems[0].set_.ctrl_._0_4_);
  local_d98.sets_._M_elems[0].set_.ctrl_ = (ctrl_t *)0x7fffffff00000000;
  pmVar2 = hash_internal::GetSharedRng();
  local_918.sets_._M_elems[0].set_.slots_._0_4_ =
       std::uniform_int_distribution<int>::operator()
                 ((uniform_int_distribution<int> *)&local_d98,pmVar2,(param_type *)&local_d98);
  local_d98.sets_._M_elems[0].set_.ctrl_ =
       (ctrl_t *)
       hash_testing_internal::WithId<phmap::priv::StatefulTestingHash>::
       next_id<phmap::priv::StatefulTestingHash>()::gId;
  local_db8 = hash_testing_internal::WithId<phmap::priv::StatefulTestingEqual>::
              next_id<phmap::priv::StatefulTestingEqual>()::gId;
  local_dc0.id_ = 0;
  hash_testing_internal::WithId<phmap::priv::StatefulTestingHash>::
  next_id<phmap::priv::StatefulTestingHash>()::gId =
       (param_type)
       ((long)hash_testing_internal::WithId<phmap::priv::StatefulTestingHash>::
              next_id<phmap::priv::StatefulTestingHash>()::gId + 1);
  hash_testing_internal::WithId<phmap::priv::StatefulTestingEqual>::
  next_id<phmap::priv::StatefulTestingEqual>()::gId =
       (param_type)
       ((long)hash_testing_internal::WithId<phmap::priv::StatefulTestingEqual>::
              next_id<phmap::priv::StatefulTestingEqual>()::gId + 1);
  parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::FlatHashSetPolicy<int>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<int>>
  ::parallel_hash_set<int_const*>
            ((parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::FlatHashSetPolicy<int>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<int>>
              *)&local_498,(int *)&local_918,
             (int *)((long)&local_918.sets_._M_elems[0].set_.slots_ + 4),0,(hasher *)&local_d98,
             (key_equal *)&local_db8,&local_dc0);
  local_d98.sets_._M_elems[0].set_.ctrl_ =
       (ctrl_t *)
       local_498.sets_._M_elems[0].set_.settings_.
       super__Tuple_impl<0UL,_unsigned_long,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>
       .
       super__Tuple_impl<1UL,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>
       .super__Tuple_impl<2UL,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>.
       super__Tuple_impl<3UL,_phmap::priv::Alloc<int>_>.
       super__Head_base<3UL,_phmap::priv::Alloc<int>,_false>._M_head_impl.id_;
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>
  ::parallel_hash_set(&local_918,&local_498,(allocator_type *)&local_d98);
  local_db8._M_a = 0;
  local_db8._M_b = 0x7fffffff;
  pmVar2 = hash_internal::GetSharedRng();
  local_d9c = std::uniform_int_distribution<int>::operator()
                        ((uniform_int_distribution<int> *)&local_db8,pmVar2,&local_db8);
  local_db8 = hash_testing_internal::WithId<phmap::priv::StatefulTestingHash>::
              next_id<phmap::priv::StatefulTestingHash>()::gId;
  local_dc0.id_ =
       (size_t)hash_testing_internal::WithId<phmap::priv::StatefulTestingEqual>::
               next_id<phmap::priv::StatefulTestingEqual>()::gId;
  local_da8.data_ = (AssertHelperData *)0x0;
  hash_testing_internal::WithId<phmap::priv::StatefulTestingHash>::
  next_id<phmap::priv::StatefulTestingHash>()::gId =
       (param_type)
       ((long)hash_testing_internal::WithId<phmap::priv::StatefulTestingHash>::
              next_id<phmap::priv::StatefulTestingHash>()::gId + 1);
  hash_testing_internal::WithId<phmap::priv::StatefulTestingEqual>::
  next_id<phmap::priv::StatefulTestingEqual>()::gId =
       (param_type)
       ((long)hash_testing_internal::WithId<phmap::priv::StatefulTestingEqual>::
              next_id<phmap::priv::StatefulTestingEqual>()::gId + 1);
  parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::FlatHashSetPolicy<int>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<int>>
  ::parallel_hash_set<int_const*>
            ((parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::FlatHashSetPolicy<int>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<int>>
              *)&local_d98,&local_d9c,(int *)&local_d98,0,(hasher *)&local_db8,
             (key_equal *)&local_dc0,(allocator_type *)&local_da8);
  lVar3 = 0;
  do {
    raw_hash_set<phmap::priv::FlatHashSetPolicy<int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>
    ::move_assign((raw_hash_set<phmap::priv::FlatHashSetPolicy<int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>
                   *)((long)&local_d98.sets_._M_elems[0].set_.ctrl_ + lVar3),
                  (long)&local_918.sets_._M_elems[0].set_.ctrl_ + lVar3);
    lVar3 = lVar3 + 0x48;
  } while (lVar3 != 0x480);
  testing::internal::
  CmpHelperEQ<phmap::parallel_flat_hash_set<int,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<int>,4ul,phmap::NullMutex>,phmap::parallel_flat_hash_set<int,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<int>,4ul,phmap::NullMutex>>
            ((internal *)&local_db8,"m","n",
             (parallel_flat_hash_set<int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>,_4UL,_phmap::NullMutex>
              *)&local_498,
             (parallel_flat_hash_set<int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>,_4UL,_phmap::NullMutex>
              *)&local_d98);
  if ((char)local_db8._M_a == '\0') {
    testing::Message::Message((Message *)&local_dc0);
    if (local_db0 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = (local_db0->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_da8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_set_constructor_test.h"
               ,0x1ca,message);
    testing::internal::AssertHelper::operator=(&local_da8,(Message *)&local_dc0);
    testing::internal::AssertHelper::~AssertHelper(&local_da8);
    if ((long *)local_dc0.id_ != (long *)0x0) {
      (**(code **)(*(long *)local_dc0.id_ + 8))();
    }
  }
  if (local_db0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_db0,local_db0);
  }
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>
  ::~parallel_hash_set(&local_d98);
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>
  ::~parallel_hash_set(&local_918);
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::FlatHashSetPolicy<int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<int>_>
  ::~parallel_hash_set(&local_498);
  return;
}

Assistant:

TYPED_TEST_P(ConstructorTest, MoveAssignmentOverwritesExisting) {
  using T = hash_internal::GeneratedType<TypeParam>;
  hash_internal::Generator<T> gen;
  TypeParam m({gen(), gen(), gen()});
  TypeParam t(m);
  TypeParam n({gen()});
  n = std::move(t);
  EXPECT_EQ(m, n);
}